

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

atomic<void_*> * __thiscall
google::protobuf::internal::ThreadSafeArena::SerialArenaChunk::id(SerialArenaChunk *this,uint32_t i)

{
  if (((ulong)this & 7) == 0) {
    if (i < *(uint *)(this + 8)) {
      return (atomic<void_*> *)(this + (ulong)i * 8 + 0x10);
    }
    id();
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, std::integer_sequence<unsigned long, 1>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0>, std::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<google::protobuf::internal::SerialArenaChunkHeader, std::atomic<void *>, std::atomic<google::protobuf::internal::SerialArena *>>, StaticSizeSeq = std::integer_sequence<unsigned long, 1>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = const char]"
               );
}

Assistant:

std::atomic<void*>& id(uint32_t i) {
    ABSL_DCHECK_LT(i, capacity());
    return Layout().Pointer<kIds>(ptr())[i];
  }